

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Empty_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Empty_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  value_type vVar3;
  int *count;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  AssertionResult gtest_ar__3;
  TypeParam empty_ht;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  uint i;
  undefined8 in_stack_fffffffffffffd88;
  int iVar4;
  char *in_stack_fffffffffffffd90;
  allocator_type *alloc;
  undefined8 in_stack_fffffffffffffd98;
  Type TVar5;
  key_equal *eql;
  AssertHelper *in_stack_fffffffffffffda0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_00;
  int *expected_max_items;
  string local_248 [24];
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 uVar6;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdf0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1d0;
  key_equal local_1c0;
  allocator_type local_1b4 [9];
  string local_120 [55];
  undefined1 local_e9;
  AssertionResult local_e8;
  string local_d8 [55];
  byte local_a1;
  AssertionResult local_a0 [3];
  value_type local_64;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc54f75);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             (bool *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(type *)0xc54f97)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,TVar5,in_stack_fffffffffffffd90,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,
               (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xc55058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc550ef);
  expected_max_items =
       &(in_RDI->
        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
        super_TransparentHasher.super_Hasher.num_compares_;
  local_64 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                            in_stack_fffffffffffffd6c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffdf0,
           (value_type *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  bVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc55139);
  local_a1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             (bool *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(type *)0xc5515d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,TVar5,in_stack_fffffffffffffd90,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,
               (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0xc55230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc552c4);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::clear((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)0xc552d2);
  local_e9 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc552e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             (bool *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(type *)0xc55302)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,TVar5,in_stack_fffffffffffffd90,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,
               (Message *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_120);
    testing::Message::~Message((Message *)0xc553d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc5546c);
  alloc = local_1b4;
  i = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd6c);
  eql = &local_1c0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd6c);
  count = (int *)(ulong)i;
  this_00 = &local_1d0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_00,i,count);
  iVar4 = (int)((ulong)count >> 0x20);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_RDI,(size_type)expected_max_items,(hasher *)this_00,eql,alloc);
  TVar5 = (Type)((ulong)eql >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1d0);
  vVar3 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                         in_stack_fffffffffffffd6c);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffdf0,
           (value_type *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
         (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  uVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc55555);
  uVar6 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffd70),
             (bool *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(type *)0xc55581)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar6,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar5,(char *)alloc,iVar4,(char *)CONCAT44(i,vVar3));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdf0,
               (Message *)CONCAT17(uVar6,in_stack_fffffffffffffde8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_248);
    testing::Message::~Message((Message *)0xc5567a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc55702);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc5570f);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Empty) {
  EXPECT_TRUE(this->ht_.empty());

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());

  this->ht_.clear();
  EXPECT_TRUE(this->ht_.empty());

  TypeParam empty_ht;
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.swap(empty_ht);
  EXPECT_TRUE(this->ht_.empty());
}